

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::OutputFile::OutputFile(OutputFile *this,OutputPartData *part)

{
  bool bVar1;
  string *__lhs;
  Data *pDVar2;
  ArgExc *this_00;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile = (_func_int **)&PTR__OutputFile_001e3dc0;
  this->_data = (Data *)0x0;
  __lhs = Header::type_abi_cxx11_(&part->header);
  bVar1 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )SCANLINEIMAGE_abi_cxx11_);
  if (!bVar1) {
    pDVar2 = (Data *)operator_new(0x148);
    Data::Data(pDVar2,part->numThreads);
    this->_data = pDVar2;
    pDVar2->_streamData = part->mutex;
    pDVar2->_deleteStream = false;
    pDVar2->multiPart = part->multipart;
    initialize(this,&part->header);
    pDVar2 = this->_data;
    pDVar2->partNumber = part->partNumber;
    pDVar2->lineOffsetsPosition = part->chunkOffsetTablePosition;
    pDVar2->previewPosition = part->previewPosition;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Can\'t build a OutputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

OutputFile::OutputFile (const OutputPartData* part) : _data (NULL)
{
    try
    {
        if (part->header.type () != SCANLINEIMAGE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a OutputFile from a type-mismatched part.");

        _data                = new Data (part->numThreads);
        _data->_streamData   = part->mutex;
        _data->_deleteStream = false;
        _data->multiPart     = part->multipart;

        initialize (part->header);
        _data->partNumber          = part->partNumber;
        _data->lineOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition     = part->previewPosition;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        if (_data) delete _data;

        REPLACE_EXC (
            e,
            "Cannot initialize output part "
            "\"" << part->partNumber
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        if (_data) delete _data;

        throw;
    }
}